

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O3

void CuStringAppend(CuString *str,char *text)

{
  size_t sVar1;
  char *__dest;
  char *__s;
  ulong uVar2;
  
  __s = "NULL";
  if (text != (char *)0x0) {
    __s = text;
  }
  sVar1 = strlen(__s);
  uVar2 = (long)(int)sVar1 + (long)str->length;
  if ((int)uVar2 + 1 < str->size) {
    __dest = str->buffer;
  }
  else {
    __dest = (char *)realloc(str->buffer,uVar2 + 0x101);
    str->buffer = __dest;
    str->size = (int)(uVar2 + 0x101);
    uVar2 = (ulong)(uint)((int)sVar1 + str->length);
  }
  str->length = (int)uVar2;
  strcat(__dest,__s);
  return;
}

Assistant:

void CuStringAppend(CuString* str, const char* text)
{
	int length;

	if (text == NULL) {
		text = "NULL";
	}

	length = strlen(text);
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	str->length += length;
	strcat(str->buffer, text);
}